

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O3

int cinemo::args::processArgs
              (int argc,char **argv,Options *options,
              vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *lw)

{
  char *__s;
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  int iVar4;
  string workDir;
  string arg1;
  string arg2;
  allocator local_b1;
  string local_b0;
  char *local_90;
  long local_88;
  char local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_90 = local_80;
  local_88 = 0;
  local_80[0] = '\0';
  local_48 = 0;
  local_40[0] = 0;
  __s = *argv;
  local_50 = local_40;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&local_b0,0,(char *)0x0,(ulong)__s);
  if (argc == 1) {
LAB_00103e4d:
    getWorkingDirectoryFromExec(&local_b0);
  }
  else {
    if ((argc & 0xfffffffeU) != 2) goto LAB_00103fb7;
    std::__cxx11::string::string((string *)local_70,argv[1],&local_b1);
    std::__cxx11::string::operator=((string *)&local_90,(string *)local_70);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    lVar2 = std::__cxx11::string::find((char *)&local_90,0x109034,0);
    if (lVar2 != 0) {
      std::__cxx11::string::string((string *)local_70,argv[1],&local_b1);
      std::__cxx11::string::operator=((string *)&local_b0,(string *)local_70);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      goto LAB_00103e4d;
    }
    iVar4 = 0;
    lVar2 = std::__cxx11::string::find((char *)&local_90,0x1090a6,0);
    if (lVar2 == 1) {
      printUsage();
      goto LAB_001040d4;
    }
    iVar4 = 0;
    lVar2 = std::__cxx11::string::find((char *)&local_90,0x1093a6,0);
    if (lVar2 == 1) {
      wh::printFlags();
      goto LAB_001040d4;
    }
    lVar2 = std::__cxx11::string::find((char *)&local_90,0x109478,0);
    if (lVar2 == 1) {
      options->verbose = true;
      if ((uint)argc < 3) goto LAB_00103e4d;
      std::__cxx11::string::string((string *)local_70,argv[2],&local_b1);
      std::__cxx11::string::operator=((string *)&local_b0,(string *)local_70);
      if (local_70[0] != local_60) {
LAB_00103fb2:
        operator_delete(local_70[0]);
      }
    }
    else {
      lVar2 = std::__cxx11::string::find((char *)&local_90,0x10971f,0);
      if (lVar2 != 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Invalid option \'",0x10);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_90,local_88);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'. Use -h for usage.",0x14);
        iVar4 = 1;
        std::endl<char,std::char_traits<char>>(poVar3);
        goto LAB_001040d4;
      }
      options->noThread = true;
      if ((uint)argc < 3) goto LAB_00103e4d;
      std::__cxx11::string::string((string *)local_70,argv[2],&local_b1);
      std::__cxx11::string::operator=((string *)&local_b0,(string *)local_70);
      if (local_70[0] != local_60) goto LAB_00103fb2;
    }
  }
LAB_00103fb7:
  bVar1 = isValidWorkDirectory(&local_b0);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Looking for wave files in ",0x1a);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    bVar1 = getWaveFiles(&local_b0,lw);
    if (!bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Can not find any WAV file(s) in ",0x20);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_b0._M_dataplus._M_p,local_b0._M_string_length)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      goto LAB_001040be;
    }
  }
  else {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," Is not a directory.",0x14);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
LAB_001040be:
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  iVar4 = 0;
LAB_001040d4:
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return iVar4;
}

Assistant:

int args::processArgs(int argc, char* argv[], args::Options& options,
                          vector<LameWrapper*>& lw) {

        string workDir;
        string arg1;
        string arg2;

        //FIXME I know I might be blamed for this mess, but later I'll use getopt header
        workDir = argv[0];

        if (argc == 1) {

#ifdef WIN32
            //If no arguments given, this code finds the current exe directory
            //FIXME this assumes system is not UNICODE
            HMODULE hModule = GetModuleHandleW(nullptr);
            WCHAR buffer[MAX_PATH];
            GetModuleFileNameW(hModule, buffer, MAX_PATH);
            char path[MAX_PATH * 2];
            std::wcstombs(path, buffer, MAX_PATH * 2);
            string exePath(path);
            int rIndex = exePath.find_last_of(PATH_SEPARATOR);
            if(rIndex == 0 || rIndex == string::npos) {
                cout << "Can not determine the current executable directory,"
                    << " please pass the directory as an argument."
                    << " Use -h for more information.";
                return 1;
            }
            workDir = exePath.substr(0, rIndex);
#endif
            getWorkingDirectoryFromExec(workDir);
        } else if (argc == 2 || argc == 3) {
            arg1 = string(argv[1]);
            if (arg1.find("-") == 0) {
                if (arg1.find("h") == 1) {
                    args::printUsage();
                    return 0;
                } else if (arg1.find("e") == 1) {
                    wh::printFlags();
                    return 0;
                } else if (arg1.find("v") == 1) {
                    options.verbose = true;
                    if (argc < 3) {
                        getWorkingDirectoryFromExec(workDir);
                    } else if (argc == 3) {
                        workDir = string(argv[2]);
                    }
                } else if (arg1.find("n") == 1) {
                    options.noThread = true;
                    if (argc < 3) {
                        getWorkingDirectoryFromExec(workDir);
                    } else if (argc == 3) {
                        workDir = string(argv[2]);
                    }
                } else {
                    cout << "Invalid option '" << arg1
                         << "'. Use -h for usage." << endl;
                    return 1;
                }
            } else {
                workDir = string(argv[1]);
                getWorkingDirectoryFromExec(workDir);
            }
        }

        if (isValidWorkDirectory(workDir)) {
            cout << "Looking for wave files in " << workDir << endl;
            if (!getWaveFiles(workDir, lw)) {
                cout << "Can not find any WAV file(s) in " << workDir << endl;
            }
        } else {
            cout << workDir << " Is not a directory." << endl;
        }

        return 0;
    }